

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O2

void __thiscall
cppgenerate::Constructor::printImplementation
          (Constructor *this,Class *parent,ostream *stream,bool inHeader)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  pointer pPVar4;
  pointer pMVar5;
  pointer pPVar6;
  pointer pMVar7;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
  initializerVariables;
  MemberVariable memberVar;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> local_148;
  Constructor *local_128;
  string local_120;
  string local_100;
  string local_e0;
  undefined1 local_c0 [48];
  size_type local_90;
  
  local_148.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_start = (MemberVariable *)0x0;
  local_148.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (MemberVariable *)0x0;
  local_148.
  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = this;
  Class::getName_abi_cxx11_(&local_100,parent);
  printConstructorSignature(local_128,stream,&local_100,!inHeader);
  std::__cxx11::string::~string((string *)&local_100);
  pMVar7 = (parent->m_memberVariables).
           super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar5 = (parent->m_memberVariables).
                super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar7; pMVar5 = pMVar5 + 1) {
    MemberVariable::MemberVariable((MemberVariable *)local_c0,pMVar5);
    Variable::initializer_abi_cxx11_(&local_120,(Variable *)local_c0);
    sVar2 = local_120._M_string_length;
    std::__cxx11::string::~string((string *)&local_120);
    if (sVar2 != 0) {
      std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::
      push_back(&local_148,(MemberVariable *)local_c0);
    }
    MemberVariable::~MemberVariable((MemberVariable *)local_c0);
  }
  if (local_148.
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_148.
      super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pPVar6 = (parent->m_parents).
             super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar4 = (parent->m_parents).
             super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar4 == pPVar6) goto LAB_001155c9;
  }
  std::operator<<(stream," : ");
  pPVar6 = (parent->m_parents).
           super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (parent->m_parents).
           super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001155c9:
  bVar1 = false;
  for (; pMVar5 = local_148.
                  super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pPVar6 != pPVar4; pPVar6 = pPVar6 + 1)
  {
    Class::Parent::Parent((Parent *)local_c0,pPVar6);
    if (bVar1) {
      poVar3 = std::operator<<(stream,",");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<(stream,(string *)local_c0);
    std::operator<<(poVar3,"( ");
    if (local_90 != 0) {
      std::operator<<(stream,(string *)(local_c0 + 0x28));
    }
    std::operator<<(stream," )");
    Class::Parent::~Parent((Parent *)local_c0);
    bVar1 = true;
  }
  for (pMVar7 = local_148.
                super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar5; pMVar7 = pMVar7 + 1) {
    MemberVariable::MemberVariable((MemberVariable *)local_c0,pMVar7);
    if (bVar1) {
      std::operator<<(stream,", ");
    }
    Variable::name_abi_cxx11_(&local_120,(Variable *)local_c0);
    poVar3 = std::operator<<(stream,(string *)&local_120);
    poVar3 = std::operator<<(poVar3,"( ");
    Variable::initializer_abi_cxx11_(&local_e0,(Variable *)local_c0);
    poVar3 = std::operator<<(poVar3,(string *)&local_e0);
    poVar3 = std::operator<<(poVar3," )");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_120);
    MemberVariable::~MemberVariable((MemberVariable *)local_c0);
    bVar1 = true;
  }
  poVar3 = std::operator<<(stream,"{");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = operator<<(stream,&local_128->m_code);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(stream,"}");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::~vector
            (&local_148);
  return;
}

Assistant:

void Constructor::printImplementation( const cppgenerate::Class* parent, std::ostream& stream, bool inHeader ) const{
    bool comma = false;
    std::vector<cppgenerate::MemberVariable> initializerVariables;

    printConstructorSignature( stream, parent->getName(), !inHeader );

    for( cppgenerate::MemberVariable memberVar : parent->m_memberVariables ){
        if( memberVar.initializer().size() ){
            initializerVariables.push_back( memberVar );
        }
    }

    if( initializerVariables.size() || parent->m_parents.size() ) stream << " : ";

    for( cppgenerate::Class::Parent clparent : parent->m_parents ){
        if( comma ) stream << "," << std::endl;
        stream << clparent.parentName << "( ";
        if( clparent.initializer.size() ) stream << clparent.initializer;
        stream << " )";
        comma = true;
    }


    for( cppgenerate::MemberVariable memberVar : initializerVariables ){
        if( comma ) stream << ", ";
        stream << memberVar.name() << "( " << memberVar.initializer() << " )" << std::endl;
        comma = true;
    }

    stream << "{" << std::endl;

    stream << m_code << std::endl;
    stream << "}" << std::endl;
}